

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance1.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<int> __l;
  ostream *poVar1;
  reference pvVar2;
  allocator<int> local_4d;
  int local_4c [3];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> v;
  char **argv_local;
  int argc_local;
  
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)argv;
  print_compiler();
  local_4c[0] = 2;
  local_4c[1] = 3;
  local_4c[2] = 4;
  local_40 = local_4c;
  local_38 = 3;
  std::allocator<int>::allocator(&local_4d);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,__l,&local_4d);
  std::allocator<int>::~allocator(&local_4d);
  poVar1 = std::operator<<((ostream *)&std::cout,"v[1] = ");
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_30,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  std::operator<<(poVar1,'\n');
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return 0;
}

Assistant:

extern template class std::vector<int>;

int main (int argc, char* argv[]) 
{
    print_compiler();

    std::vector<int> v= {2, 3, 4};
    std::cout << "v[1] = " << v[1] << '\n';

    return 0;
}